

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_fuse.hpp
# Opt level: O2

optional<enum_fuse_t> magic_enum::enum_fuse<Color,Directions>(Color values,Directions values_1)

{
  _Optional_base<enum_fuse_t,_true,_true> _Var1;
  
  _Var1._M_payload.super__Optional_payload_base<enum_fuse_t> =
       (_Optional_payload<enum_fuse_t,_true,_true,_true>)
       detail::typesafe_fuse_enum<Color,Directions>(values,values_1);
  if (((undefined1  [16])_Var1._M_payload.super__Optional_payload_base<enum_fuse_t> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return (_Optional_base<enum_fuse_t,_true,_true>)
           (_Optional_base<enum_fuse_t,_true,_true>)
           _Var1._M_payload.super__Optional_payload_base<enum_fuse_t>;
  }
  __assert_fail("(fuse)",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/include/magic_enum/magic_enum_fuse.hpp"
                ,0x54,"auto magic_enum::enum_fuse(Es...) [Es = <Color, Directions>]");
}

Assistant:

[[nodiscard]] constexpr auto enum_fuse(Es... values) noexcept {
  static_assert((std::is_enum_v<std::decay_t<Es>> && ...), "magic_enum::enum_fuse requires enum type.");
  static_assert(sizeof...(Es) >= 2, "magic_enum::enum_fuse requires at least 2 values.");
  static_assert((detail::log2(enum_count<std::decay_t<Es>>() + 1) + ...) <= (sizeof(std::uintmax_t) * 8), "magic_enum::enum_fuse does not work for large enums");
#if defined(MAGIC_ENUM_NO_TYPESAFE_ENUM_FUSE)
  const auto fuse = detail::fuse_enum<std::decay_t<Es>...>(values...);
#else
  const auto fuse = detail::typesafe_fuse_enum<std::decay_t<Es>...>(values...);
#endif
  return MAGIC_ENUM_ASSERT(fuse), fuse;
}